

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envmaplight.hpp
# Opt level: O2

Color __thiscall EnvLight::radiance(EnvLight *this,Ray *ray)

{
  Image *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  Color CVar5;
  vec2f local_18;
  
  dVar1 = (double)PI;
  this_00 = this->texture;
  dVar2 = atan2((double)(ray->dir).z,(double)(ray->dir).x);
  fVar4 = 1.0 / PI;
  dVar3 = acos((double)(ray->dir).y);
  local_18.y = (float)(dVar3 * (double)fVar4);
  local_18.x = (float)(dVar2 * (0.5 / dVar1) + 0.5);
  CVar5 = Image::sample(this_00,&local_18);
  return CVar5;
}

Assistant:

Color radiance(const Ray& ray) const
	{
		return texture->sample(vec2f(
			0.5+(0.5/PI)*atan2(ray.dir.z, ray.dir.x),
			(1/PI)*acos(ray.dir.y)
		));
	}